

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O1

uint64_t mask_most_signif_bytes(uint_fast8_t n)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  undefined3 in_register_00000039;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  if (CONCAT31(in_register_00000039,n) == 0) {
    return 0;
  }
  uVar5 = (ulong)(n + 3 & 0xfffffffc);
  auVar7 = vpbroadcastq_avx512vl();
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar11._8_8_ = 0x38;
  auVar11._0_8_ = 0x38;
  auVar11._16_8_ = 0x38;
  auVar11._24_8_ = 0x38;
  auVar12._8_8_ = 0xff;
  auVar12._0_8_ = 0xff;
  auVar12._16_8_ = 0xff;
  auVar12._24_8_ = 0xff;
  auVar13._8_8_ = 4;
  auVar13._0_8_ = 4;
  auVar13._16_8_ = 4;
  auVar13._24_8_ = 4;
  do {
    auVar4 = auVar9;
    auVar8 = auVar10._0_32_;
    auVar9 = vpsllq_avx2(auVar4,3);
    auVar9 = vpsubq_avx2(auVar11,auVar9);
    auVar9 = vpsllvq_avx2(auVar12,auVar9);
    auVar3 = vpor_avx2(auVar9,auVar8);
    auVar10 = ZEXT3264(auVar3);
    auVar9 = vpaddq_avx2(auVar4,auVar13);
    uVar5 = uVar5 - 4;
  } while (uVar5 != 0);
  uVar5 = vpcmpuq_avx512vl(auVar4,auVar7,6);
  uVar5 = uVar5 & 0xf;
  auVar9 = vmovdqa64_avx512vl(auVar8);
  bVar1 = (bool)((byte)uVar5 & 1);
  auVar6._0_8_ = (ulong)bVar1 * auVar9._0_8_ | (ulong)!bVar1 * auVar3._0_8_;
  bVar1 = (bool)((byte)(uVar5 >> 1) & 1);
  auVar6._8_8_ = (ulong)bVar1 * auVar9._8_8_ | (ulong)!bVar1 * auVar3._8_8_;
  bVar1 = (bool)((byte)(uVar5 >> 2) & 1);
  auVar7._16_8_ = (ulong)bVar1 * auVar9._16_8_ | (ulong)!bVar1 * auVar3._16_8_;
  auVar7._0_16_ = auVar6;
  auVar7._24_8_ = (uVar5 >> 3) * auVar9._24_8_ | (ulong)!SUB81(uVar5 >> 3,0) * auVar3._24_8_;
  auVar6 = vpor_avx(auVar6,auVar7._16_16_);
  auVar2 = vpshufd_avx(auVar6,0xee);
  auVar6 = vpor_avx(auVar6,auVar2);
  return auVar6._0_8_;
}

Assistant:

uint64_t
mask_most_signif_bytes(uint_fast8_t n)
{
    uint64_t x = 0;
    // Unsigned int should be the fastest unsigned on the machine.
    // Using it to avoid warnings about <<-operator with signed value.
    for (unsigned int i = 0; i < n; i++)
    {
        x |= 0xFFULL << (56U - 8U * i);
    }
    return x;
}